

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::print_features(vw *all,example *ec)

{
  pointer pbVar1;
  byte bVar2;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  float *pfVar4;
  pointer pcVar5;
  pointer pbVar6;
  long lVar7;
  pointer psVar8;
  vw *pvVar9;
  byte *pbVar10;
  ostream *poVar11;
  string_value *sv;
  unsigned_long *puVar12;
  pointer psVar13;
  float *pfVar14;
  long lVar15;
  audit_results dat;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<GD::string_value_*,_std::vector<GD::string_value,_std::allocator<GD::string_value>_>_>,_GD::string_value>
  local_a8;
  audit_results local_90;
  vw *local_50;
  features *local_48;
  byte *local_40;
  byte *local_38;
  
  if (all->lda == 0) {
    local_90.offset = (ec->super_example_predict).ft_offset;
    local_90.ns_pre.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.ns_pre.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.ns_pre.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>._M_impl
    .super__Vector_impl_data._M_start = (string_value *)0x0;
    local_90.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>._M_impl
    .super__Vector_impl_data._M_finish = (string_value *)0x0;
    local_90.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbVar10 = (ec->super_example_predict).indices._begin;
    local_40 = (ec->super_example_predict).indices._end;
    local_90.all = all;
    local_50 = all;
    if (pbVar10 != local_40) {
      local_48 = (ec->super_example_predict).feature_space;
      do {
        bVar2 = *pbVar10;
        psVar3 = local_48[bVar2].space_names._begin;
        pfVar14 = local_48[bVar2].values._begin;
        pfVar4 = local_48[bVar2].values._end;
        local_38 = pbVar10;
        if (local_48[bVar2].space_names._end == psVar3) {
          if (pfVar14 != pfVar4) {
            puVar12 = local_48[bVar2].indicies._begin;
            do {
              audit_feature(&local_90,*pfVar14,(ec->super_example_predict).ft_offset + *puVar12);
              pfVar14 = pfVar14 + 1;
              puVar12 = puVar12 + 1;
            } while (pfVar14 != pfVar4);
          }
        }
        else if (pfVar14 != pfVar4) {
          puVar12 = local_48[bVar2].indicies._begin;
          lVar15 = 0;
          do {
            audit_interaction(&local_90,
                              *(audit_strings **)
                               ((long)&(psVar3->
                                       super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar15 * 4));
            audit_feature(&local_90,*(float *)((long)pfVar14 + lVar15),
                          (ec->super_example_predict).ft_offset +
                          *(long *)((long)puVar12 + lVar15 * 2));
            if (local_90.ns_pre.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_90.ns_pre.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pbVar1 = local_90.ns_pre.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1;
              pcVar5 = local_90.ns_pre.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
              pbVar6 = local_90.ns_pre.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1;
              local_90.ns_pre.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar5 != &pbVar6->field_2) {
                operator_delete(pcVar5);
              }
            }
            lVar7 = lVar15 + 4;
            lVar15 = lVar15 + 4;
          } while ((float *)((long)pfVar14 + lVar7) != pfVar4);
        }
        pbVar10 = local_38 + 1;
      } while (pbVar10 != local_40);
    }
    pvVar9 = local_50;
    if ((local_50->weights).sparse == true) {
      INTERACTIONS::
      generate_interactions<GD::audit_results,_const_unsigned_long,_&GD::audit_feature,_true,_&GD::audit_interaction,_sparse_parameters>
                (&local_50->interactions,local_50->permutations,&ec->super_example_predict,&local_90
                 ,&(local_50->weights).sparse_weights);
    }
    else {
      INTERACTIONS::
      generate_interactions<GD::audit_results,_const_unsigned_long,_&GD::audit_feature,_true,_&GD::audit_interaction,_dense_parameters>
                (&local_50->interactions,local_50->permutations,&ec->super_example_predict,&local_90
                 ,&(local_50->weights).dense_weights);
    }
    psVar13 = local_90.results.
              super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>._M_impl.
              super__Vector_impl_data._M_finish;
    psVar8 = local_90.results.
             super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_90.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_90.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      lVar15 = ((long)local_90.results.
                      super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.results.
                      super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<GD::string_value_*,_std::vector<GD::string_value,_std::allocator<GD::string_value>_>_>,_GD::string_value>
      ::_Temporary_buffer(&local_a8,
                          (__normal_iterator<GD::string_value_*,_std::vector<GD::string_value,_std::allocator<GD::string_value>_>_>
                           )local_90.results.
                            super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                          (lVar15 - (lVar15 + 1 >> 0x3f)) + 1 >> 1);
      if (local_a8._M_buffer == (pointer)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<GD::string_value*,std::vector<GD::string_value,std::allocator<GD::string_value>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (psVar8,psVar13);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<GD::string_value*,std::vector<GD::string_value,std::allocator<GD::string_value>>>,GD::string_value*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (psVar8,psVar13,local_a8._M_buffer,local_a8._M_len);
      }
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<GD::string_value_*,_std::vector<GD::string_value,_std::allocator<GD::string_value>_>_>,_GD::string_value>
      ::~_Temporary_buffer(&local_a8);
    }
    psVar8 = local_90.results.
             super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pvVar9->audit == true) {
      if (local_90.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_90.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        psVar13 = local_90.results.
                  super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_a8._M_original_len._0_1_ = 9;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)&local_a8,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,(psVar13->s)._M_dataplus._M_p,(psVar13->s)._M_string_length);
          psVar13 = psVar13 + 1;
        } while (psVar13 != psVar8);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
    }
    std::vector<GD::string_value,_std::allocator<GD::string_value>_>::~vector(&local_90.results);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90.ns_pre);
    return;
  }
  print_lda_features(all,ec);
  return;
}

Assistant:

void print_features(vw& all, example& ec)
{
  if (all.lda > 0)
    print_lda_features(all, ec);
  else
  {
    audit_results dat(all, ec.ft_offset);

    for (features& fs : ec)
    {
      if (fs.space_names.size() > 0)
        for (features::iterator_all& f : fs.values_indices_audit())
        {
          audit_interaction(dat, f.audit().get());
          audit_feature(dat, f.value(), f.index() + ec.ft_offset);
          audit_interaction(dat, NULL);
        }
      else
        for (features::iterator& f : fs) audit_feature(dat, f.value(), f.index() + ec.ft_offset);
    }

    INTERACTIONS::generate_interactions<audit_results, const uint64_t, audit_feature, true, audit_interaction>(
        all, ec, dat);

    stable_sort(dat.results.begin(), dat.results.end());
    if (all.audit)
    {
      for (string_value& sv : dat.results) cout << '\t' << sv.s;
      cout << endl;
    }
  }
}